

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_group_ops
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  pointer ppLVar4;
  pointer ppLVar5;
  long *plVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  Layer *pLVar11;
  long lVar12;
  _func_int *p_Var13;
  int iVar14;
  void *in_R8;
  int i;
  long lVar15;
  uint uVar16;
  void *pvVar17;
  Allocator *pAVar18;
  int i_00;
  Allocator *pAVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int local_290;
  uint local_28c;
  Mat local_288;
  int local_23c;
  Mat local_238;
  Allocator *local_1f0;
  int *piStack_1e8;
  long local_1e0;
  uint local_1d8;
  Allocator *local_1d0;
  undefined8 local_1c8;
  ulong uStack_1c0;
  uint local_1b8;
  size_t local_1b0;
  Allocator *local_1a8;
  int *piStack_1a0;
  long local_198;
  uint local_190;
  Allocator *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  uint local_170;
  size_t local_168;
  void *local_160;
  int *piStack_158;
  long lStack_150;
  undefined4 uStack_148;
  long *local_140;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined8 local_120;
  void *local_118;
  int *piStack_110;
  long lStack_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined8 local_d8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c8;
  size_t local_c0;
  Allocator *local_b8;
  long local_b0;
  Mat local_a8;
  size_t local_60;
  Option *local_58;
  undefined1 *local_50;
  size_t local_48;
  ParamDict pd;
  
  p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  iVar14 = *(int *)(&this->field_0xd8 + (long)p_Var13) * *(int *)(&this->field_0xd4 + (long)p_Var13)
  ;
  iVar2 = *(int *)(&this->field_0x108 + (long)p_Var13);
  uVar9 = (long)*(int *)(&this->field_0x104 + (long)p_Var13) / (long)iVar2;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)iVar14;
  local_c8 = &this->group_ops;
  lVar15 = 0;
  local_58 = opt;
  while( true ) {
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3) <= lVar15) break;
    if (ppLVar4[lVar15] != (Layer *)0x0) {
      (*ppLVar4[lVar15]->_vptr_Layer[1])();
    }
    lVar15 = lVar15 + 1;
  }
  if (ppLVar5 != ppLVar4) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  iVar3 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  i_00 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) / iVar3
  ;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c8,(long)iVar3);
  local_50 = &this->field_0x118;
  local_23c = (((int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                     (long)(iVar10 / iVar2)) * iVar2) / iVar3) * iVar14 * i_00;
  local_48 = (size_t)local_23c;
  local_60 = (size_t)i_00;
  lVar15 = 0;
  while( true ) {
    local_238.c = 1;
    p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
    if (*(int *)(&this->field_0x108 + (long)p_Var13) <= lVar15) break;
    local_238.elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var13);
    local_238.data =
         (void *)(lVar15 * local_48 * local_238.elemsize +
                 *(long *)(&this->field_0x168 + (long)p_Var13));
    local_238.elempack = *(int *)(&this->field_0x180 + (long)p_Var13);
    local_238.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var13);
    local_238.refcount = (int *)0x0;
    local_238.w = (int)local_48;
    local_238.dims = 1;
    local_238.h = 1;
    local_238.d = 1;
    local_238.cstep = local_48;
    Mat::clone(&local_a8,(__fn *)&local_238,(void *)0x0,(int)local_238.data,in_R8);
    if (local_238.refcount != (int *)0x0) {
      LOCK();
      *local_238.refcount = *local_238.refcount + -1;
      UNLOCK();
      if (*local_238.refcount == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          free(local_238.data);
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
    bVar20 = *(int *)(&this->field_0x100 + (long)p_Var13) == 0;
    if (bVar20) {
      pAVar19 = (Allocator *)0x0;
      local_b0 = 0;
      local_28c = 0;
      local_b8 = (Allocator *)0x0;
      local_290 = 0;
      local_c0 = 0;
    }
    else {
      local_b0 = *(long *)(&this->field_0x1c0 + (long)p_Var13);
      pAVar19 = (Allocator *)
                (lVar15 * local_60 * local_b0 + *(long *)(&this->field_0x1b0 + (long)p_Var13));
      local_28c = *(uint *)(&this->field_0x1c8 + (long)p_Var13);
      local_b8 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var13);
      local_c0 = local_60;
      local_290 = i_00;
    }
    bVar20 = !bVar20;
    uVar16 = (uint)bVar20;
    pLVar11 = create_layer(6);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,*(int *)(&this->field_0xd4 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,0xb,*(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,2,*(int *)(&this->field_0xdc +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,0xc,*(int *)(&this->field_0xe0 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,3,*(int *)(&this->field_0xe4 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,0xd,*(int *)(&this->field_0xe8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,5,*(int *)(&this->field_0x100 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,6,local_23c);
    ParamDict::set(&pd,8,*(int *)(&this->field_0x10c +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,9,*(int *)(&this->field_0x110 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    ParamDict::set(&pd,10,(Mat *)(local_50 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]))
    ;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) == 0) {
      lVar12 = 0x40;
      auVar22._0_12_ = ZEXT812(0);
      auVar22._12_4_ = 0;
      do {
        *(undefined8 *)((long)&local_238.data + lVar12) = 0;
        *(undefined1 (*) [16])((long)&local_288.elemsize + lVar12) = auVar22;
        *(undefined1 (*) [16])(&local_288.field_0x1c + lVar12) = auVar22;
        *(undefined1 (*) [16])((long)&local_288.h + lVar12) = auVar22;
        *(undefined1 (*) [16])(&local_288.field_0x3c + lVar12) = auVar22;
        lVar12 = lVar12 + 0x48;
      } while (lVar12 != 0x160);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_238.refcount != (int *)0x0) {
        LOCK();
        *local_238.refcount = *local_238.refcount + -1;
        UNLOCK();
        if (*local_238.refcount == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            free(local_238.data);
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_238.data = local_a8.data;
      local_238.refcount = local_a8.refcount;
      local_238.elemsize = local_a8.elemsize;
      local_238.elempack = local_a8.elempack;
      local_238.allocator = local_a8.allocator;
      local_238.dims = local_a8.dims;
      local_238.w = local_a8.w;
      local_238.h = local_a8.h;
      local_238.d = local_a8.d;
      local_238.c = local_a8.c;
      local_238.cstep = local_a8.cstep;
      p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
      if (*(int *)(&this->field_0x10c + (long)p_Var13) != 0) {
        local_288.cstep = 0;
        local_288.data = (Allocator *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elempack = 0;
        local_288.elemsize._4_4_ = (int)local_288.refcount;
        local_288.allocator = (Allocator *)local_288.data;
        local_288.dims = (int)local_288.refcount;
        local_288.w = local_288.elempack;
        local_288.h = (int)local_288.elemsize;
        local_288.d = (int)local_288.refcount;
        local_288.c = local_288.elempack;
        Mat::create(&local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 (*(long *)(&this->field_0x1f8 +
                           (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) + lVar15 * 4);
        iVar10 = local_288.c * (int)local_288.cstep;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
          *(undefined4 *)((long)(_func_int ***)local_288.data + lVar12 * 4) = uVar1;
        }
        piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        if (piStack_1e8 != (int *)0x0) {
          LOCK();
          *piStack_1e8 = *piStack_1e8 + -1;
          UNLOCK();
          if (*piStack_1e8 == 0) {
            if (local_1d0 == (Allocator *)0x0) {
              free(local_1f0);
            }
            else {
              (*local_1d0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1e8 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_1f0 = (Allocator *)local_288.data;
        local_1e0 = CONCAT44(local_288.elemsize._4_4_,(int)local_288.elemsize);
        local_1d8 = local_288.elempack;
        local_1d0 = local_288.allocator;
        local_1c8 = CONCAT44(local_288.w,local_288.dims);
        uStack_1c0 = CONCAT44(local_288.d,local_288.h);
        local_1b8 = local_288.c;
        local_1b0 = local_288.cstep;
        p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        lVar12 = *(long *)(&this->field_0x250 + (long)p_Var13);
        pAVar18 = (Allocator *)(lVar12 * lVar15 + *(long *)(&this->field_0x240 + (long)p_Var13));
        uVar16 = *(uint *)(&this->field_0x258 + (long)p_Var13);
        pAVar19 = *(Allocator **)(&this->field_0x260 + (long)p_Var13);
        if (piStack_1a0 != (int *)0x0) {
          LOCK();
          *piStack_1a0 = *piStack_1a0 + -1;
          UNLOCK();
          if (*piStack_1a0 == 0) {
            if (local_188 == (Allocator *)0x0) {
              free(local_1a8);
            }
            else {
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1a0 = (int *)0x0;
        local_180 = 0x100000001;
        uStack_178 = 0x100000001;
        local_170 = 1;
        local_168 = 1;
        piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_1a8 = pAVar18;
        local_198 = lVar12;
        local_190 = uVar16;
        local_188 = pAVar19;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              free(local_288.data);
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
      }
      if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
        lVar12 = *(long *)(&this->field_0x298 + (long)p_Var13);
        lVar7 = *(long *)(&this->field_0x288 + (long)p_Var13);
        uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var13);
        plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var13);
        if (piStack_158 != (int *)0x0) {
          LOCK();
          *piStack_158 = *piStack_158 + -1;
          UNLOCK();
          if (*piStack_158 == 0) {
            if (local_140 == (long *)0x0) {
              free(local_160);
            }
            else {
              (**(code **)(*local_140 + 0x18))();
            }
          }
        }
        piStack_158 = (int *)0x0;
        local_138 = 1;
        uStack_134 = 1;
        uStack_130 = 1;
        uStack_12c = 1;
        local_128 = 1;
        local_120 = 1;
        local_160 = (void *)(lVar12 * lVar15 + lVar7);
        lStack_150 = lVar12;
        uStack_148 = uVar1;
        local_140 = plVar6;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_238);
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
      lVar12 = 0xd8;
      do {
        piVar8 = *(int **)((long)&local_238.refcount + lVar12);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            plVar6 = *(long **)((long)&local_238.allocator + lVar12);
            if (plVar6 == (long *)0x0) {
              free(*(void **)((long)&local_238.data + lVar12));
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_238.cstep + lVar12) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_238.elemsize + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_238.data + lVar12) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar12) = 0;
        *(undefined4 *)((long)&local_238.c + lVar12) = 0;
        *(undefined8 *)((long)&local_238.dims + lVar12) = 0;
        *(undefined8 *)((long)&local_238.h + lVar12) = 0;
        lVar12 = lVar12 + -0x48;
      } while (lVar12 != -0x48);
    }
    else {
      lVar12 = 0x40;
      auVar21._0_12_ = ZEXT812(0);
      auVar21._12_4_ = 0;
      do {
        *(undefined8 *)((long)&local_238.data + lVar12) = 0;
        *(undefined1 (*) [16])((long)&local_288.elemsize + lVar12) = auVar21;
        *(undefined1 (*) [16])(&local_288.field_0x1c + lVar12) = auVar21;
        *(undefined1 (*) [16])((long)&local_288.h + lVar12) = auVar21;
        *(undefined1 (*) [16])(&local_288.field_0x3c + lVar12) = auVar21;
        lVar12 = lVar12 + 0x48;
      } while (lVar12 != 0x1a8);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_238.refcount != (int *)0x0) {
        LOCK();
        *local_238.refcount = *local_238.refcount + -1;
        UNLOCK();
        if (*local_238.refcount == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            free(local_238.data);
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_238.data = local_a8.data;
      local_238.refcount = local_a8.refcount;
      local_238.elemsize = local_a8.elemsize;
      local_238.elempack = local_a8.elempack;
      local_238.allocator = local_a8.allocator;
      local_238.dims = local_a8.dims;
      local_238.w = local_a8.w;
      local_238.h = local_a8.h;
      local_238.d = local_a8.d;
      local_238.c = local_a8.c;
      local_238.cstep = local_a8.cstep;
      if (piStack_1e8 != (int *)0x0) {
        LOCK();
        *piStack_1e8 = *piStack_1e8 + -1;
        UNLOCK();
        if (*piStack_1e8 == 0) {
          if (local_1d0 == (Allocator *)0x0) {
            free(local_1f0);
          }
          else {
            (*local_1d0->_vptr_Allocator[3])();
          }
        }
      }
      piStack_1e8 = (int *)0x0;
      local_1e0 = local_b0;
      local_1d8 = local_28c;
      local_1d0 = local_b8;
      local_1c8 = CONCAT44(local_290,uVar16);
      uStack_1c0 = (ulong)CONCAT14(bVar20,uVar16);
      local_1b0 = local_c0;
      p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
      local_1f0 = pAVar19;
      local_1b8 = uVar16;
      if (*(int *)(&this->field_0x10c + (long)p_Var13) != 0) {
        local_288.cstep = 0;
        local_288.data = (Allocator *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elemsize._4_4_ = 0;
        local_288.elempack = 0;
        local_288.h = 0;
        local_288.d = 0;
        local_288.c = 0;
        local_288.allocator = (Allocator *)0x0;
        local_288.dims = 0;
        local_288.w = 0;
        Mat::create(&local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 (*(long *)(&this->field_0x1f8 +
                           (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) + lVar15 * 4);
        iVar10 = local_288.c * (int)local_288.cstep;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
          *(undefined4 *)((long)(_func_int ***)local_288.data + lVar12 * 4) = uVar1;
        }
        piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        if (piStack_1a0 != (int *)0x0) {
          LOCK();
          *piStack_1a0 = *piStack_1a0 + -1;
          UNLOCK();
          if (*piStack_1a0 == 0) {
            if (local_188 == (Allocator *)0x0) {
              free(local_1a8);
            }
            else {
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1a0 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_1a8 = (Allocator *)local_288.data;
        local_198 = CONCAT44(local_288.elemsize._4_4_,(int)local_288.elemsize);
        local_190 = local_288.elempack;
        local_188 = local_288.allocator;
        local_180 = CONCAT44(local_288.w,local_288.dims);
        uStack_178 = CONCAT44(local_288.d,local_288.h);
        local_170 = local_288.c;
        local_168 = local_288.cstep;
        p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        lVar12 = *(long *)(&this->field_0x250 + (long)p_Var13);
        pvVar17 = (void *)(lVar12 * lVar15 + *(long *)(&this->field_0x240 + (long)p_Var13));
        uVar1 = *(undefined4 *)(&this->field_0x258 + (long)p_Var13);
        plVar6 = *(long **)(&this->field_0x260 + (long)p_Var13);
        if (piStack_158 != (int *)0x0) {
          LOCK();
          *piStack_158 = *piStack_158 + -1;
          UNLOCK();
          if (*piStack_158 == 0) {
            if (local_140 == (long *)0x0) {
              free(local_160);
            }
            else {
              (**(code **)(*local_140 + 0x18))();
            }
          }
        }
        piStack_158 = (int *)0x0;
        local_138 = 1;
        uStack_134 = 1;
        uStack_130 = 1;
        uStack_12c = 1;
        local_128 = 1;
        local_120 = 1;
        piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_160 = pvVar17;
        lStack_150 = lVar12;
        uStack_148 = uVar1;
        local_140 = plVar6;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              free(local_288.data);
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        p_Var13 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
      }
      if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
        lVar12 = *(long *)(&this->field_0x298 + (long)p_Var13);
        lVar7 = *(long *)(&this->field_0x288 + (long)p_Var13);
        uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var13);
        plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var13);
        if (piStack_110 != (int *)0x0) {
          LOCK();
          *piStack_110 = *piStack_110 + -1;
          UNLOCK();
          if (*piStack_110 == 0) {
            if (local_f8 == (long *)0x0) {
              free(local_118);
            }
            else {
              (**(code **)(*local_f8 + 0x18))();
            }
          }
        }
        piStack_110 = (int *)0x0;
        local_f0 = 1;
        uStack_ec = 1;
        uStack_e8 = 1;
        uStack_e4 = 1;
        local_e0 = 1;
        local_d8 = 1;
        local_118 = (void *)(lVar12 * lVar15 + lVar7);
        lStack_108 = lVar12;
        uStack_100 = uVar1;
        local_f8 = plVar6;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_238);
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
      lVar12 = 0x120;
      do {
        piVar8 = *(int **)((long)&local_238.refcount + lVar12);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            plVar6 = *(long **)((long)&local_238.allocator + lVar12);
            if (plVar6 == (long *)0x0) {
              free(*(void **)((long)&local_238.data + lVar12));
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_238.cstep + lVar12) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_238.elemsize + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_238.data + lVar12) = 0;
        *(undefined8 *)((long)&local_238.refcount + lVar12) = 0;
        *(undefined4 *)((long)&local_238.c + lVar12) = 0;
        *(undefined8 *)((long)&local_238.dims + lVar12) = 0;
        *(undefined8 *)((long)&local_238.h + lVar12) = 0;
        lVar12 = lVar12 + -0x48;
      } while (lVar12 != -0x48);
    }
    (*pLVar11->_vptr_Layer[4])(pLVar11,local_58);
    (local_c8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar15] = pLVar11;
    ParamDict::~ParamDict(&pd);
    if (local_a8.refcount != (int *)0x0) {
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          free(local_a8.data);
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    lVar15 = lVar15 + 1;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}